

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O2

size_t __thiscall
CVmObjDate::format_date
          (CVmObjDate *this,char *buf,size_t buflen,char *fmt,size_t fmtlen,CVmDateLocale *lc,
          multicaldate_t *date,int32_t dayno,int32_t daytime,char *tzabbr,int32_t tzofs)

{
  ulong uVar1;
  bool bVar2;
  bignum_t<32> b;
  bool bVar3;
  int v;
  uint uVar4;
  int32_t iVar5;
  int iVar6;
  byte *pbVar7;
  char *fmt_00;
  long lVar8;
  byte bVar9;
  uint uVar10;
  ulong uVar11;
  byte *pbVar12;
  long i;
  byte *pbVar13;
  int *piVar14;
  byte bVar15;
  int iVar16;
  ldiv_t lVar17;
  undefined4 uVar18;
  byte *local_128;
  byte *local_120;
  byte *local_118;
  CVmDateLocale *local_110;
  byte *local_108;
  size_t subfmtl;
  uint local_f8;
  uint local_f4;
  int local_f0;
  uint local_ec;
  uint local_e8;
  uint local_e4;
  uint local_e0;
  uint local_dc;
  CVmObjDate *local_d8;
  ulong local_d0;
  ulong local_c8;
  double local_c0;
  int iy;
  int local_b4;
  int iStack_b0;
  bignum_t<32> bdt;
  bignum_t<32> local_60;
  bignum_t<32> bdn;
  
  local_118 = (byte *)0x0;
  local_dc = daytime % 1000;
  iVar6 = (int)((long)daytime / 1000);
  local_f8 = -tzofs;
  local_e0 = (uint)((long)((ulong)(uint)(iVar6 >> 0x1f) << 0x20 | (long)daytime / 1000 & 0xffffffffU
                          ) % 0x3c);
  local_c8 = (ulong)(uint)(43199999 < daytime);
  local_e4 = (uint)((long)((ulong)(uint)((int)((long)daytime / 60000) >> 0x1f) << 0x20 |
                          (long)daytime / 60000 & 0xffffffffU) % 0x3c);
  local_d0 = (long)daytime / 3600000 & 0xffffffff;
  uVar10 = (uint)((long)daytime / 3600000);
  uVar4 = uVar10 - 0xc;
  if (daytime < 46800000) {
    uVar4 = uVar10;
  }
  local_e8 = 0xc;
  if (0x6ddcfe < daytime + 3599999U) {
    local_e8 = uVar4;
  }
  local_c0 = ((double)(dayno + -0xafa6c) * 24.0 * 60.0 * 60.0 + (double)iVar6) -
             (double)(tzofs / 1000);
  local_ec = (43199999 < daytime) + 2;
  local_f0 = dayno + 1;
  uVar1 = 1;
  local_128 = (byte *)buf;
  local_120 = (byte *)buflen;
  local_110 = lc;
  local_d8 = this;
  while( true ) {
    if (fmtlen == 0) {
      if (local_120 != (byte *)0x0) {
        *local_128 = 0;
      }
      return (size_t)local_118;
    }
    pbVar7 = local_128;
    pbVar12 = local_120;
    if ((fmtlen != 1) && (*fmt == 0x25)) break;
    local_118 = local_118 + 1;
    if (local_120 != (byte *)0x0) {
      *local_128 = *fmt;
      pbVar7 = local_128 + 1;
      pbVar12 = local_120 + -1;
    }
LAB_0024d074:
    local_120 = pbVar12;
    local_128 = pbVar7;
    fmt = (char *)((byte *)fmt + 1);
    fmtlen = fmtlen - 1;
  }
  pbVar13 = (byte *)0x0;
  bVar9 = 0;
  bVar3 = false;
  iVar6 = 0;
  do {
    fmt = (char *)((byte *)fmt + 1);
    bVar2 = true;
    uVar11 = fmtlen - 1;
LAB_0024c69b:
    do {
      fmtlen = uVar11;
      bVar15 = *fmt;
      if ((!bVar2) || (fmtlen < 2)) {
        iVar16 = (int)pbVar13;
        switch(bVar15) {
        case 0x25:
          local_118 = local_118 + 1;
          if (local_120 != (byte *)0x0) {
            *local_128 = 0x25;
            pbVar7 = local_128 + 1;
            pbVar12 = local_120 + -1;
          }
          goto LAB_0024d074;
        default:
          if (local_120 == (byte *)0x0) {
            local_118 = local_118 + 2;
          }
          else {
            *local_128 = 0x25;
            local_118 = local_118 + 2;
            pbVar7 = local_128 + 1;
            pbVar12 = local_120 + -1;
            if (local_120 + -1 != (byte *)0x0) {
              local_128[1] = *fmt;
              pbVar7 = local_128 + 2;
              pbVar12 = local_120 + -2;
            }
          }
          goto LAB_0024d074;
        case 0x41:
          uVar4 = (*date->_vptr_multicaldate_t[4])();
          bVar9 = 2;
          goto LAB_0024cb26;
        case 0x42:
          iVar6 = date->m_ + -1;
          bVar9 = 0;
          uVar10 = 0;
          goto LAB_0024cec3;
        case 0x43:
          iVar16 = 2;
          uVar11 = (long)date->y_ / 100 & 0xffffffff;
          break;
        case 0x44:
          iVar6 = 0xb;
          goto LAB_0024cc24;
        case 0x45:
        case 0x65:
          uVar10 = date->y_;
          local_f4 = 1 - uVar10;
          if (0 < (int)uVar10) {
            local_f4 = uVar10;
          }
          if (((bVar15 == 0x65 && bVar3) || ((bVar15 == 0x45 && !bVar3) && 0 < (int)uVar10)) ||
             ((bVar15 == 0x45 && bVar3) && (int)uVar10 < 1)) {
            local_108 = pbVar13;
            _wrtlistitem((char **)&local_128,(size_t *)&local_120,(size_t *)&local_118,lc,5,
                         (uint)((int)uVar10 < 1),0);
            local_118 = local_118 + 1;
            if (local_120 != (byte *)0x0) {
              *local_128 = 0x20;
              local_120 = local_120 + -1;
              local_128 = local_128 + 1;
            }
            iVar16 = 1;
            uVar10 = local_f4;
            pbVar13 = local_108;
            goto LAB_0024d067;
          }
          local_108 = (byte *)CONCAT44(local_108._4_4_,(uint)((int)uVar10 < 1));
          _wrtnum((char **)&local_128,(size_t *)&local_120,(size_t *)&local_118,local_f4,1,iVar6,
                  bVar9,iVar16);
          lc = local_110;
          local_118 = local_118 + 1;
          if (local_120 != (byte *)0x0) {
            *local_128 = 0x20;
            local_120 = local_120 + -1;
            local_128 = local_128 + 1;
          }
          _wrtlistitem((char **)&local_128,(size_t *)&local_120,(size_t *)&local_118,local_110,5,
                       (int)local_108,0);
          pbVar7 = local_128;
          pbVar12 = local_120;
          goto LAB_0024d074;
        case 0x46:
          subfmtl = 8;
          fmt_00 = "%Y-%m-%d";
          goto LAB_0024cc35;
        case 0x47:
        case 0x67:
          local_108 = pbVar13;
          (*date->_vptr_multicaldate_t[6])(date,&iy);
          iVar16 = (*fmt != 0x67U) + 2 + (uint)(*fmt != 0x67U);
          pbVar13 = local_108;
          v = iy;
          goto LAB_0024cf13;
        case 0x48:
          iVar16 = 2;
          uVar11 = local_d0;
          break;
        case 0x49:
          iVar16 = 2;
          uVar11 = (ulong)local_e8;
          break;
        case 0x4a:
          piVar14 = (int *)(local_d8->super_CVmObject).ext_;
          lVar8 = (long)piVar14[1];
          i = lVar8 + -43200000;
          if (lVar8 < 0x2932e01) {
            i = lVar8;
          }
          bignum_t<32>::bignum_t(&bdn,(ulong)(43200000 < lVar8) + (long)*piVar14);
          bignum_t<32>::bignum_t(&bdt,i);
          bignum_t<32>::operator+=(&bdn,0x1a431f);
          bignum_t<32>::operator/(&local_60,&bdt,86400000);
          uVar18 = local_60.ext._17_4_;
          b.ext[0x10] = local_60.ext[0x10];
          b.ext[0xd] = local_60.ext[0xd];
          b.ext[0xe] = local_60.ext[0xe];
          b.ext[0xf] = local_60.ext[0xf];
          b.ext[8] = local_60.ext[8];
          b.ext[9] = local_60.ext[9];
          b.ext[10] = local_60.ext[10];
          b.ext[0xb] = local_60.ext[0xb];
          b.ext[0xc] = local_60.ext[0xc];
          b.ext[0] = local_60.ext[0];
          b.ext[1] = local_60.ext[1];
          b.ext[2] = local_60.ext[2];
          b.ext[3] = local_60.ext[3];
          b.ext[4] = local_60.ext[4];
          b.ext[5] = local_60.ext[5];
          b.ext[6] = local_60.ext[6];
          b.ext[7] = local_60.ext[7];
          b.ext[0x11] = (char)uVar18;
          b.ext[0x12] = (char)((uint)uVar18 >> 8);
          b.ext[0x13] = (char)((uint)uVar18 >> 0x10);
          b.ext[0x14] = (char)((uint)uVar18 >> 0x18);
          bignum_t<32>::operator+=(&bdn,b);
          bignum_t<32>::format(&bdn,(char *)&iy,0x40,-1,10);
          pbVar12 = local_128;
          pbVar7 = (byte *)(ulong)(ushort)iy;
          pbVar13 = local_120 + -(long)pbVar7;
          if (local_120 < pbVar7) {
            if (local_120 != (byte *)0x0) {
              piVar14 = (int *)((long)&iy + 2);
LAB_0024cd92:
              pbVar13 = local_120;
              pbVar12 = local_128;
              local_108 = pbVar7;
              memcpy(local_128,piVar14,(size_t)local_120);
              local_128 = pbVar12 + (long)pbVar13;
              pbVar7 = local_108;
              local_120 = (byte *)0x0;
            }
          }
          else {
            local_108 = pbVar7;
            memcpy(local_128,(void *)((long)&iy + 2),(size_t)pbVar7);
            local_128 = pbVar12 + (long)local_108;
            pbVar7 = local_108;
            local_120 = pbVar13;
          }
          goto LAB_0024cfda;
        case 0x4d:
          iVar16 = 2;
          uVar11 = (ulong)local_e4;
          break;
        case 0x4e:
          iVar16 = 3;
          uVar11 = (ulong)local_dc;
          break;
        case 0x50:
          uVar10 = 4;
          uVar11 = local_c8;
          goto LAB_0024cec1;
        case 0x52:
          iVar6 = 0xd;
          goto LAB_0024cc24;
        case 0x53:
          iVar16 = 2;
          uVar11 = (ulong)local_e0;
          break;
        case 0x54:
          iVar6 = 0xe;
          goto LAB_0024cc24;
        case 0x55:
          iVar16 = 0;
          goto LAB_0024cbff;
        case 0x56:
          local_108 = pbVar13;
          v = (*date->_vptr_multicaldate_t[6])(date,0);
          goto LAB_0024cc09;
        case 0x57:
          iVar16 = 1;
LAB_0024cbff:
          local_108 = pbVar13;
          v = multicaldate_t::weekno(date,iVar16);
LAB_0024cc09:
          iVar16 = 2;
          pbVar13 = local_108;
          goto LAB_0024cf13;
        case 0x58:
          iVar6 = 9;
          goto LAB_0024cc24;
        case 0x59:
          uVar10 = date->y_;
          iVar16 = 4;
          goto LAB_0024ce0e;
        case 0x5a:
          local_118 = local_118 + 1;
          if (tzofs < 0) {
            uVar10 = local_f8;
            if (local_120 != (byte *)0x0) {
              *local_128 = 0x2d;
              local_120 = local_120 + -1;
              local_128 = local_128 + 1;
            }
          }
          else {
            uVar10 = tzofs;
            if (local_120 != (byte *)0x0) {
              *local_128 = 0x2b;
              local_120 = local_120 + -1;
              local_128 = local_128 + 1;
            }
          }
          local_108 = (byte *)CONCAT44(local_108._4_4_,uVar10);
          _wrtnum((char **)&local_128,(size_t *)&local_120,(size_t *)&local_118,uVar10 / 3600000,2,
                  iVar6,bVar9,iVar16);
          uVar10 = (uint)(ushort)((ushort)(((ulong)local_108 & 0xffffffff) / 60000) % 0x3c);
          iVar16 = 2;
          iVar6 = 0;
LAB_0024d067:
          _wrtnum((char **)&local_128,(size_t *)&local_120,(size_t *)&local_118,uVar10,iVar16,iVar6,
                  bVar9,(int)pbVar13);
          lc = local_110;
          pbVar7 = local_128;
          pbVar12 = local_120;
          goto LAB_0024d074;
        case 0x61:
          uVar4 = (*date->_vptr_multicaldate_t[4])();
          bVar9 = 3;
LAB_0024cb26:
          uVar10 = (uint)bVar9;
          lc = local_110;
          uVar11 = (ulong)uVar4;
          goto LAB_0024cec1;
        case 0x62:
          uVar10 = 1;
          uVar11 = (ulong)(date->m_ - 1);
          goto LAB_0024cec1;
        case 99:
          iVar6 = 8;
          goto LAB_0024cc24;
        case 100:
          uVar10 = date->d_;
          goto LAB_0024cdff;
        case 0x6a:
          iy = date->y_;
          local_b4 = 1;
          iStack_b0 = 1;
          local_108 = pbVar13;
          iVar5 = caldate_t::dayno((caldate_t *)&iy);
          iVar16 = 3;
          pbVar13 = local_108;
          v = local_f0 - iVar5;
          goto LAB_0024cf13;
        case 0x6d:
          uVar10 = date->m_;
LAB_0024cdff:
          iVar16 = 2;
LAB_0024ce0e:
          uVar11 = (ulong)uVar10;
          break;
        case 0x70:
          uVar10 = 4;
          uVar11 = (ulong)local_ec;
LAB_0024cec1:
          iVar6 = (int)uVar11;
          bVar9 = 0;
LAB_0024cec3:
          _wrtlistitem((char **)&local_128,(size_t *)&local_120,(size_t *)&local_118,lc,uVar10,iVar6
                       ,(uint)bVar9);
          lc = local_110;
          pbVar7 = local_128;
          pbVar12 = local_120;
          goto LAB_0024d074;
        case 0x72:
          iVar6 = 0xc;
          goto LAB_0024cc24;
        case 0x73:
          sprintf((char *)&iy,"%.0lf",local_c0);
          pbVar7 = (byte *)strlen((char *)&iy);
          pbVar12 = local_120 + -(long)pbVar7;
          if (local_120 < pbVar7) {
            if (local_120 != (byte *)0x0) {
              piVar14 = &iy;
              goto LAB_0024cd92;
            }
          }
          else {
            local_108 = local_128;
            memcpy(local_128,&iy,(size_t)pbVar7);
            local_128 = pbVar7 + (long)local_108;
            local_120 = pbVar12;
          }
LAB_0024cfda:
          local_118 = local_118 + (long)pbVar7;
          lc = local_110;
          pbVar7 = local_128;
          pbVar12 = local_120;
          goto LAB_0024d074;
        case 0x74:
          _wrtnum((char **)&local_128,(size_t *)&local_120,(size_t *)&local_118,date->d_,1,iVar6,
                  bVar9,iVar16);
          iVar6 = ordinal_index(date->d_);
          uVar10 = 7;
          bVar9 = 1;
          lc = local_110;
          goto LAB_0024cec3;
        case 0x75:
          local_108 = pbVar13;
          v = (*date->_vptr_multicaldate_t[5])();
          goto LAB_0024cef9;
        case 0x77:
          local_108 = pbVar13;
          v = (*date->_vptr_multicaldate_t[4])();
LAB_0024cef9:
          iVar16 = 1;
          pbVar13 = local_108;
          goto LAB_0024cf13;
        case 0x78:
          iVar6 = 10;
LAB_0024cc24:
          fmt_00 = CVmDateLocale::get(lc,&subfmtl,iVar6);
          lc = local_110;
LAB_0024cc35:
          pbVar12 = local_120;
          pbVar7 = local_128;
          pbVar13 = (byte *)format_date(local_d8,(char *)local_128,(size_t)local_120,fmt_00,subfmtl,
                                        lc,date,dayno,daytime,tzabbr,tzofs);
          local_118 = local_118 + (long)pbVar13;
          lc = local_110;
          if (pbVar12 < pbVar13) {
            local_120 = (byte *)0x0;
            pbVar7 = pbVar7 + (long)pbVar12;
            pbVar12 = local_120;
          }
          else {
            pbVar7 = pbVar7 + (long)pbVar13;
            pbVar12 = pbVar12 + -(long)pbVar13;
          }
          goto LAB_0024d074;
        case 0x79:
          local_108 = pbVar13;
          lVar17 = ldiv((long)date->y_,100);
          iVar16 = 2;
          pbVar13 = local_108;
          v = (int)lVar17.rem;
          goto LAB_0024cf13;
        case 0x7a:
          for (pbVar13 = (byte *)tzabbr; pbVar7 = local_128, pbVar12 = local_120, *pbVar13 != 0;
              pbVar13 = pbVar13 + 1) {
            if (local_120 == (byte *)0x0) {
              local_120 = (byte *)0x0;
            }
            else {
              *local_128 = *pbVar13;
              local_128 = local_128 + 1;
              local_120 = local_120 + -1;
            }
            local_118 = local_118 + 1;
          }
          goto LAB_0024d074;
        }
        v = (int)uVar11;
LAB_0024cf13:
        _wrtnum((char **)&local_128,(size_t *)&local_120,(size_t *)&local_118,v,iVar16,iVar6,bVar9,
                (int)pbVar13);
        lc = local_110;
        pbVar7 = local_128;
        pbVar12 = local_120;
        goto LAB_0024d074;
      }
      uVar11 = uVar1;
      if (bVar15 == 0x23) {
        fmt = (char *)((byte *)fmt + 1);
        fmtlen = fmtlen - 1;
        bVar2 = true;
        iVar6 = 1;
        if (fmtlen < 2) goto LAB_0024c69b;
        bVar15 = *fmt;
        iVar6 = 1;
        bVar2 = true;
      }
      else {
        bVar2 = false;
      }
      if ((bVar15 == 0x20) || (bVar15 == 0x15)) {
        fmt = (char *)((byte *)fmt + 1);
        fmtlen = fmtlen - 1;
        bVar2 = true;
        bVar9 = bVar15;
        if (fmtlen < 2) goto LAB_0024c69b;
        bVar2 = true;
        bVar15 = *fmt;
      }
      if (bVar15 != 0x2d) goto LAB_0024c731;
      fmt = (char *)((byte *)fmt + 1);
      fmtlen = fmtlen - 1;
      bVar2 = true;
      bVar3 = true;
      if (fmtlen < 2) goto LAB_0024c69b;
      bVar15 = *fmt;
      bVar3 = true;
      bVar2 = true;
LAB_0024c731:
      uVar11 = fmtlen;
    } while (bVar15 != 0x26);
    pbVar13 = (byte *)0x1;
  } while( true );
}

Assistant:

size_t CVmObjDate::format_date(VMG_ char *buf, size_t buflen,
                               const char *fmt, size_t fmtlen,
                               CVmDateLocale *lc,
                               const multicaldate_t *date,
                               int32_t dayno, int32_t daytime,
                               const char *tzabbr, int32_t tzofs) const
{
    const char *subfmt;
    size_t subfmtl;
    
    /* we haven't written anything to the buffer yet */
    size_t outlen = 0;

    /* scan the format string */
    for ( ; fmtlen != 0 ; ++fmt, --fmtlen)
    {
        if (*fmt == '%' && fmtlen >= 2)
        {
            /* skip the '%' */
            ++fmt, --fmtlen;

            /* parse flags */
            int pound = FALSE;
            int minus = FALSE;
            int roman = FALSE;
            char leadsp = 0;
            for (int found_flag = TRUE ; found_flag && fmtlen >= 2 ; )
            {
                /* assume we won't find another flag on this pass */
                found_flag = FALSE;
                
                /* check for the '#' flag (meaning varies by format code) */
                if (fmtlen >= 2 && *fmt == '#')
                {
                    pound = found_flag = TRUE;
                    ++fmt, --fmtlen;
                }
                
                /* ' ' and '\ ' (replace leading zeros with spaces) */
                if (fmtlen >= 2 && (*fmt == ' ' || *fmt == 0x15))
                {
                    leadsp = *fmt;
                    found_flag = TRUE;
                    ++fmt, --fmtlen;
                }

                /* check for '-' flag */
                if (fmtlen >= 2 && *fmt == '-')
                {
                    minus = found_flag = TRUE;
                    ++fmt, --fmtlen;
                }

                /* check for '&' flag */
                if (fmtlen >= 2 && *fmt == '&')
                {
                    roman = found_flag = TRUE;
                    ++fmt, --fmtlen;
                }
            }

            /* get the format code */
            switch (*fmt)
            {
            case 'a':
                /* abbreviated day name */
                wrtlistitem(LC_WKDY, date->weekday(), FALSE);
                break;

            case 'A':
                /* full day name */
                wrtlistitem(LC_WEEKDAY, date->weekday(), FALSE);
                break;

            case 'd':
                /* two-digit day of month (or one digit with '#') */
                wrtnum(date->d(), 2);
                break;

            case 'j':
                /* day of year 001-366, three digits with leading zeros */
                {
                    /* 
                     *   we can calculate the day of the year by subtracting
                     *   the day number of Jan 1 from the given date (and
                     *   adding 1 to get into range 1-366) 
                     */
                    caldate_t jan1(date->y(), 1, 1);
                    int j = dayno - jan1.dayno() + 1;
                    wrtnum(j, 3);
                }
                break;

            case 'J':
                /* 
                 *   Julian day number (the 4713 BC kind); '#' suppresses the
                 *   fractional part 
                 */
                {
                    /* get the day and time */
                    long dn = get_dayno(), dt = get_daytime();

                    /* if the time is past noon, it's on the next day */
                    if (dt > 12*60*60*1000)
                        dn += 1, dt -= 12*60*60*1000;

                    /* 
                     *   figure the combined date/time value, adjusting the
                     *   day number to the Julian day Epoch 
                     */
                    bignum_t<32> bdn(dn), bdt(dt);
                    bdn += 1721119L;
                    bdn += (bdt / (long)(24*60*60*1000));

                    /* format it and write it */
                    char jbuf[64];
                    bdn.format(jbuf, sizeof(jbuf), -1, 10);
                    wrttstr(jbuf);
                }
                break;

            case 'u':
                /* day of week 1-7 Monday-Sunday (ISO weekday) */
                wrtnum(date->iso_weekday(), 1);
                break;

            case 'w':
                /* day of week 0-6 Sunday-Saturday */
                wrtnum(date->weekday(), 1);
                break;

            case 't':
                /* day of month with ordinal suffix (non-strftime) */
                wrtnum(date->d(), 1);
                wrtlistitem(LC_ORDSUF, ordinal_index(date->d()), TRUE);
                break;

            case 'U':
                /* week number, 00-53, week 1 starting with first Sunday */
                wrtnum(date->weekno(0), 2);
                break;

            case 'W':
                /* week number, 00-53, week 1 starting with first Monday */
                wrtnum(date->weekno(1), 2);
                break;

            case 'V':
                /* ISO-8601:1988 week number of the year */
                wrtnum(date->iso_weekno(0), 2);
                break;

            case 'b':
                /* abbreviated month name */
                wrtlistitem(LC_MON, date->m() - 1, FALSE);
                break;

            case 'B':
                /* full month name */
                wrtlistitem(LC_MONTH, date->m() - 1, FALSE);
                break;

            case 'm':
                /* two-digit month 01-12 (one digit with #) */
                wrtnum(date->m(), 2);
                break;

            case 'C':
                /* two-digit century (e.g., 19 for 1900-1999) */
                wrtnum(date->y() / 100, 2);
                break;

            case 'g':
            case 'G':
                /* ISO-8601:1988 year ('g'=2 digits, 'G'=4 digits) */
                {
                    /* ISO-8601:1988 week number of the year */
                    int iy;
                    date->iso_weekno(&iy);
                    wrtnum(iy, *fmt == 'g' ? 2 : 4);
                }
                break;

            case 'y':
                /* two-digit year */
                wrtnum(ldiv(date->y(), 100).rem, 2);
                break;

            case 'Y':
                /* four-digit year */
                wrtnum(date->y(), 4);
                break;

            case 'e':
            case 'E':
                /* 
                 *   Year with AD/BC era before/after the year number.  For
                 *   'e', the era is always after, or always before on '-'.
                 *   For 'E', the era is AD before/BC after, or reversed on
                 *   '-'. 
                 */
                {
                    /* figure the era: positive years are AD, <=0 are BC */
                    int idx = 0; // assume AD
                    int yy = date->y();
                    if (yy <= 0)
                    {
                        idx = 1; // BC
                        yy = -yy + 1;
                    }

                    /* 
                     *   Figure the display order: "%-e" puts the era first
                     *   in all case; "%E" puts AD first; "%-E" puts BC first
                     */
                    if ((*fmt == 'e' && minus)
                        || (*fmt == 'E' && !minus && idx == 0)
                        || (*fmt == 'E' && minus && idx == 1))
                    {
                        /* era first */
                        wrtlistitem(LC_ERA, idx, FALSE);
                        wrtch(' ');
                        wrtnum(yy, 1);
                    }
                    else
                    {
                        /* year first */
                        wrtnum(yy, 1);
                        wrtch(' ');
                        wrtlistitem(LC_ERA, idx, FALSE);
                    }
                }
                break;

            case 'H':
                /* two-digit hour, 24-hour clock */
                wrtnum(daytime/(60*60*1000), 2);
                break;

            case 'I':
                /* two-digit hour, 12-hour clock */
                {
                    int hh = daytime/(60*60*1000);
                    if (hh == 0)
                        hh = 12;
                    else if (hh >= 13)
                        hh -= 12;

                    wrtnum(hh, 2);
                }
                break;

            case 'M':
                /* two-digit minute */
                wrtnum(daytime/(60*1000) % 60, 2);
                break;

            case 'P':
                /* upper-case AM or PM */
                wrtlistitem(LC_AMPM, daytime/(60*60*1000) >= 12 ? 1 : 0, FALSE);
                break;

            case 'p':
                /* lower-case am or pm */
                wrtlistitem(LC_AMPM, daytime/(60*60*1000) >= 12 ? 3 : 2, FALSE);
                break;

            case 'r':
                /* full 12-hour clock time: %I:%M:%S %P */
                subfmt = lc->get(vmg_ subfmtl, LC_FMT_12HOUR);
                goto do_subfmt;

            do_subfmt:
                {
                    /* recursively format the new format string */
                    size_t l = format_date(
                        vmg_ buf, buflen, subfmt, subfmtl, lc,
                        date, dayno, daytime, tzabbr, tzofs);

                    /* count it in our output length */
                    outlen += l;

                    /* advance our buffer pointer past the copied text */
                    if (buflen >= l)
                        buflen -= l, buf += l;
                    else
                        buf += buflen, buflen = 0;
                }
                break;

            case 'R':
                /* 24-hour clock time w/minutes: %H:%M */
                subfmt = lc->get(vmg_ subfmtl, LC_FMT_24HOUR);
                goto do_subfmt;

            case 'S':
                /* two-digit seconds */
                wrtnum(daytime/1000 % 60, 2);
                break;

            case 'N':
                /* three-digit milliseconds (non-strftime) */
                wrtnum(daytime % 1000, 3);
                break;

            case 'T':
                /* 24-hour clock time w/seconds: %H:%M:%S */
                subfmt = lc->get(vmg_ subfmtl, LC_FMT_24HOURSECS);
                goto do_subfmt;

            case 'X':
                /* locale time representation without the date */
                subfmt = lc->get(vmg_ subfmtl, LC_FMT_TIME);
                goto do_subfmt;

            case 'z':
                /* time zone abbreviation */
                {
                    for (const char *p = tzabbr ; *p != '\0' ; ++p)
                        wrtch(*p);
                }
                break;

            case 'Z':
                /* time zone UTC offset, four digits (+0500) */
                {
                    int32_t o = tzofs;
                    if (o < 0)
                        wrtch('-'), o = -o;
                    else
                        wrtch('+');

                    wrtnum(o/(60*60*1000), 2);
                    pound = FALSE;
                    wrtnum(o/(60*1000) % 60, 2);
                }
                break;

            case 'c':
                /* preferred locale date and time stamp */
                subfmt = lc->get(vmg_ subfmtl, LC_FMT_TIMESTAMP);
                goto do_subfmt;

            case 'D':
                /* short date - %m/%d/%y */
                subfmt = lc->get(vmg_ subfmtl, LC_FMT_SHORTDATE);
                goto do_subfmt;

            case 'F':
                /* database-style date: %Y-%m-%d */
                subfmt = "%Y-%m-%d";
                subfmtl = 8;
                goto do_subfmt;

            case 's':
                /* Unix Epoch timestamp as an integer */
                {
                    /* 
                     *   The Unix timestamp is the number of seconds after
                     *   (or before, if negative) 1/1/1970 00:00 UTC.  First
                     *   calculate the number of days after (before) 1/1/1970
                     *   by subtracting the Unix Epoch day number from our
                     *   internal day number; then multiply that by the
                     *   number of seconds in a day (24*60*60) to get the
                     *   Unix timestamp of midnight on that day, then add the
                     *   number of seconds into the day ('daytime' stores
                     *   milliseconds, so divide it by 1000).
                     *   
                     *   Note that we need to adjust back to UTC by
                     *   subtracting the time zone offset.
                     *   
                     *   As we've discussed elsewhere in this file, a double
                     *   is big enough for the Unix timestamp value for any
                     *   day number we can store, and represents it exactly
                     *   since we're working in whole numbers.
                     */
                    double utime = (dayno - caldate_t::UNIX_EPOCH_DAYNO)
                                   * 24.*60.*60.
                                   + daytime/1000
                                   - tzofs/1000;

                    /* format it to a buffer and copy to the output */
                    char ubuf[60];
                    sprintf(ubuf, "%.0lf", utime);
                    wrtstr(ubuf);
                }
                break;

            case 'x':
                /* preferred locale date representation */
                subfmt = lc->get(vmg_ subfmtl, LC_FMT_DATE);
                goto do_subfmt;

            case '%':
                /* a literal % */
                wrtch('%');
                break;

            default:
                /* 
                 *   anything else is an error; copy the whole %x literally
                 *   to make the unparsed format character apparent
                 */
                wrtch('%');
                wrtch(*fmt);
                break;
            }
        }
        else
        {
            /* it's an ordinary character, so copy it literally */
            wrtch(*fmt);
        }
    }

    /* add a nul if there's room (but don't count it in the result length) */
    if (buflen > 0)
        *buf++ = '\0';

    /* return the total space needed */
    return outlen;
}